

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Request.cpp
# Opt level: O0

int __thiscall MNS::Request::Parse(Request *this,ssize_t requestLen)

{
  char *pcVar1;
  char *pcVar2;
  mapped_type *this_00;
  int iVar3;
  long in_RSI;
  long in_RDI;
  char *value;
  char *name;
  char c1;
  char c;
  int i;
  PARSER_STATE parserState;
  char *tailPos;
  key_type *in_stack_ffffffffffffff88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff90;
  allocator local_61;
  string local_60 [32];
  char *local_40;
  char *local_38;
  char local_2a;
  char local_29;
  int local_28;
  undefined4 local_24;
  void *local_20;
  
  if (-1 < in_RSI) {
    *(undefined1 *)(in_RDI + 0x60) = 0;
    *(undefined8 *)(in_RDI + 0x68) = 0;
    *(long *)(in_RDI + 0x70) = in_RSI;
  }
  local_20 = (void *)0x0;
  *(undefined4 *)(in_RDI + 0x48) = 2;
  local_24 = 0;
  local_28 = (int)*(undefined8 *)(in_RDI + 0x68);
  do {
    if (*(long *)(in_RDI + 0x70) <= (long)local_28) {
      return 0;
    }
    local_29 = *(char *)(*(long *)(in_RDI + 0x50) + (long)local_28);
    switch(local_24) {
    case 0:
      if ((local_29 == 'G') || (local_29 == 'g')) {
        *(undefined4 *)(in_RDI + 0x34) = 2;
        local_28 = local_28 + 3;
      }
      else if ((local_29 == 'O') || (local_29 == 'o')) {
        *(undefined4 *)(in_RDI + 0x34) = 1;
        local_28 = local_28 + 7;
      }
      else if ((local_29 == 'P') || (local_29 == 'p')) {
        local_2a = *(char *)(*(long *)(in_RDI + 0x50) + (long)(local_28 + 1));
        if ((local_2a == 'O') || (local_2a == 'o')) {
          *(undefined4 *)(in_RDI + 0x34) = 4;
          local_28 = local_28 + 4;
        }
        else if ((local_2a == 'U') || (local_2a == 'u')) {
          *(undefined4 *)(in_RDI + 0x34) = 5;
          local_28 = local_28 + 3;
        }
        else {
          *(undefined4 *)(in_RDI + 0x34) = 9;
          local_28 = local_28 + 5;
        }
      }
      else if ((local_29 == 'H') || (local_29 == 'h')) {
        *(undefined4 *)(in_RDI + 0x34) = 3;
        local_28 = local_28 + 4;
      }
      else if ((local_29 == 'D') || (local_29 == 'd')) {
        *(undefined4 *)(in_RDI + 0x34) = 6;
        local_28 = local_28 + 6;
      }
      else if ((local_29 == 'C') || (local_29 == 'c')) {
        *(undefined4 *)(in_RDI + 0x34) = 8;
        local_28 = local_28 + 7;
      }
      else if ((local_29 == 'T') || (local_29 == 't')) {
        *(undefined4 *)(in_RDI + 0x34) = 7;
        local_28 = local_28 + 5;
      }
      local_24 = 1;
      break;
    case 1:
      *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x50) + (long)local_28;
      local_20 = memchr(*(void **)(in_RDI + 0x40),0x20,*(long *)(in_RDI + 0x70) - (long)local_28);
      if (local_20 == (void *)0x0) {
        *(undefined4 *)(in_RDI + 0x48) = 5;
        return 1;
      }
      local_28 = (int)local_20 - (int)*(undefined8 *)(in_RDI + 0x50);
      *(undefined1 *)(*(long *)(in_RDI + 0x50) + (long)local_28) = 0;
      local_28 = local_28 + 7;
      local_24 = 2;
      break;
    case 2:
      if (local_29 == '1') {
        *(undefined4 *)(in_RDI + 0x30) = 2;
      }
      else if (local_29 == '0') {
        *(undefined4 *)(in_RDI + 0x30) = 1;
      }
      local_24 = 3;
      local_28 = local_28 + 2;
      break;
    case 3:
      local_38 = (char *)(*(long *)(in_RDI + 0x50) + (long)local_28);
      while (local_29 != ':') {
        if ('@' < local_29) {
          *(byte *)(*(long *)(in_RDI + 0x50) + (long)local_28) =
               *(byte *)(*(long *)(in_RDI + 0x50) + (long)local_28) | 0x20;
        }
        local_28 = local_28 + 1;
        local_29 = *(char *)(*(long *)(in_RDI + 0x50) + (long)local_28);
      }
      *(undefined1 *)(*(long *)(in_RDI + 0x50) + (long)local_28) = 0;
      iVar3 = 1;
      if (*(char *)(*(long *)(in_RDI + 0x50) + (long)(local_28 + 1)) == ' ') {
        iVar3 = 2;
      }
      local_28 = iVar3 + local_28;
      local_40 = (char *)(*(long *)(in_RDI + 0x50) + (long)local_28);
      local_20 = memchr((void *)(*(long *)(in_RDI + 0x50) + (long)local_28),0xd,
                        *(long *)(in_RDI + 0x70) - (long)local_28);
      pcVar2 = local_38;
      pcVar1 = local_40;
      if (local_20 == (void *)0x0) {
        *(undefined4 *)(in_RDI + 0x48) = 5;
        return 1;
      }
      iVar3 = (int)local_20 - (int)*(undefined8 *)(in_RDI + 0x50);
      local_28 = iVar3 + 1;
      *(undefined1 *)(*(long *)(in_RDI + 0x50) + (long)iVar3) = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,pcVar2,&local_61);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      std::__cxx11::string::operator=((string *)this_00,pcVar1);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      if ((*(char *)(*(long *)(in_RDI + 0x50) + (long)(local_28 + 1)) == '\r') &&
         (*(char *)(*(long *)(in_RDI + 0x50) + (long)(local_28 + 2)) == '\n')) {
        if ((*(int *)(in_RDI + 0x34) == 2) || (*(int *)(in_RDI + 0x34) == 3)) {
          if ((long)(local_28 + 3) < *(long *)(in_RDI + 0x70)) {
            *(long *)(in_RDI + 0x68) = (long)(local_28 + 3);
            return 0;
          }
          *(undefined1 *)(in_RDI + 0x60) = 1;
          return 0;
        }
        if (*(long *)(in_RDI + 0x70) <= (long)(local_28 + 3)) {
          *(undefined1 *)(in_RDI + 0x60) = 1;
          return 0;
        }
        local_24 = 4;
      }
      break;
    case 4:
      local_28 = local_28 + 2;
      *(long *)(in_RDI + 0x58) = *(long *)(in_RDI + 0x50) + (long)local_28;
      *(long *)(in_RDI + 0x78) = *(long *)(in_RDI + 0x70) - (long)local_28;
      local_24 = 5;
      break;
    default:
      local_28 = (int)*(undefined8 *)(in_RDI + 0x70);
      *(undefined1 *)(in_RDI + 0x60) = 1;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

int MNS::Request::Parse(ssize_t requestLen) {
	if(requestLen >= 0) {
		this->finished = false;
		this->lastParsePos = 0;
		this->bufferLen = requestLen;
	}

	char *tailPos = NULL;
	this->state = REQUEST_STATE::PARSING_HEADERS;
	
	PARSER_STATE parserState = PARSER_STATE::METHOD;

	for (int i = this->lastParsePos; i < this->bufferLen; i++) {
		char c = this->buffer[i];

		switch (parserState) {
			case PARSER_STATE::METHOD:
				if (c == 'G' || c == 'g') {
					this->method = HTTP_METHOD::GET;
					i += 3;
				} else if (c == 'O' || c == 'o') {
					this->method = HTTP_METHOD::OPTIONS;
					i += 7;
				} else if (c == 'P' || c == 'p') {
					char c1 = this->buffer[i + 1];
					if (c1 == 'O' || c1 == 'o') {
						this->method = HTTP_METHOD::POST;
						i += 4;
					} else if (c1 == 'U' || c1 == 'u') {
						this->method = HTTP_METHOD::PUT;
						i += 3;
					} else {
						this->method = HTTP_METHOD::PATCH;
						i += 5;
						// Todo: This may be unsafe and offset should be found
					}
				} else if (c == 'H' || c == 'h') {
					this->method = HTTP_METHOD::HEAD;
					i += 4;
				} else if (c == 'D' || c == 'd') {
					this->method = HTTP_METHOD::DELETE;
					i += 6;
				} else if (c == 'C' || c == 'c') {
					this->method = HTTP_METHOD::CONNECT;
					i += 7;
				} else if (c == 'T' || c == 't') {
					this->method = HTTP_METHOD::TRACE;
					i += 5;
				}

				parserState = PARSER_STATE::URL;
				break;
			case PARSER_STATE::URL:
				this->url = this->buffer + i;
				tailPos = (char*)memchr(this->url, ' ', this->bufferLen - i);
				if(tailPos == NULL) { // ERROR, TRY AND GET MROE DATA
					this->state = REQUEST_STATE::NEED_MORE_DATA;

					return 1;
				}
				i = (int)(tailPos - this->buffer);
				buffer[i] = '\0';

				i += 7;
				parserState = PARSER_STATE::HTTP_VERSION;
				break;
			case PARSER_STATE::HTTP_VERSION:
				if (c == '1') this->httpVersion = HTTP_VERSION::HTTP_1_1;
				else if (c == '0') this->httpVersion = HTTP_VERSION::HTTP_1_0;
				parserState = PARSER_STATE::HEADER_NAME;
				i += 2;
				break;
			case PARSER_STATE::HEADER_NAME: {
				char *name = buffer + i;
				while (c != ':') {
					if (c >= 'A') buffer[i] |= 0x20;//-= 'A' - 'a';

					c = buffer[++i];
				}

				buffer[i] = '\0';
				i += (buffer[i + 1] == ' '?2:1);

				char *value = buffer + i;
				tailPos = (char *)memchr(buffer+i, '\r', this->bufferLen - i);
				if(tailPos == NULL) { // ERROR, TRY AND GET MORE DATA
					this->state = REQUEST_STATE::NEED_MORE_DATA;

					return 1;
				} else {
					i = (int) (tailPos - buffer);
					buffer[i++] = '\0';
				}

				//this->headers[std::string(name, nameLen)] = std::string(value, valueLen);
				this->headers[name] = value;

				// Finished parsing headers
				if (buffer[i + 1] == '\r' && buffer[i + 2] == '\n') {
					// Possibility of pipelining
					if(this->method == HTTP_METHOD::GET || this->method == HTTP_METHOD::HEAD) {
						// More pipelined requests
						if(i + 3 < this->bufferLen) {
							this->lastParsePos = i+3;

							// Return back to handler
							return 0;
						} else {
							parserState = PARSER_STATE::FINISHED;
							this->finished = true;

							return 0;
						}
					} else {
						// Is request not drained
						if(i + 3 < this->bufferLen) {
							parserState = PARSER_STATE::BODY;
						} else {
							parserState = PARSER_STATE::FINISHED;
							this->finished = true;

							return 0;
						}
					}
				}

				break;
			}
			case PARSER_STATE::BODY:
				i += 2;
				// TODO: Copy the body into the message buffer to send to onData event
				this->bodyBuffer = buffer + i;
				this->bodyBufferLen = this->bufferLen - i;
				parserState = PARSER_STATE::FINISHED;
				break;
			default:
				i = this->bufferLen;
				this->finished = true;
				break;
		}
	}

	return 0;
}